

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O0

double wolfe_eval<dense_parameters>
                 (vw *all,bfgs *b,float *mem,double loss_sum,double previous_loss_sum,
                 double step_size,double importance_weight_sum,int *origin,double *wolfe1,
                 dense_parameters *weights)

{
  float fVar1;
  float fVar2;
  long lVar3;
  bool bVar4;
  uint32_t uVar5;
  char *pcVar6;
  float *pfVar7;
  int *in_RCX;
  int __c;
  long in_RDX;
  long in_RSI;
  dense_iterator<float> *rhs;
  long in_RDI;
  double *in_R8;
  dense_parameters *in_R9;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double wolfe2;
  float *mem1;
  iterator w;
  double g1_g1;
  double g1_Hg1;
  double g1_d;
  double g0_d;
  dense_parameters *in_stack_ffffffffffffff20;
  dense_iterator<float> local_a0;
  dense_iterator<float> local_88;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  dense_parameters *local_50;
  double *local_48;
  int *local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  long local_18;
  long local_10;
  long local_8;
  
  local_58 = 0.0;
  local_60 = 0.0;
  local_68 = 0.0;
  local_70 = 0.0;
  local_50 = in_R9;
  local_48 = in_R8;
  local_40 = in_RCX;
  local_38 = in_XMM3_Qa;
  local_30 = in_XMM2_Qa;
  local_28 = in_XMM1_Qa;
  local_20 = in_XMM0_Qa;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  dense_parameters::begin(in_stack_ffffffffffffff20);
  while( true ) {
    dense_parameters::end(in_stack_ffffffffffffff20);
    rhs = &local_a0;
    bVar4 = dense_iterator<float>::operator!=(&local_88,rhs);
    lVar3 = local_18;
    if (!bVar4) break;
    pcVar6 = dense_iterator<float>::index(&local_88,(char *)rhs,__c);
    uVar5 = dense_parameters::stride_shift(local_50);
    in_stack_ffffffffffffff20 =
         (dense_parameters *)
         (lVar3 + ((ulong)pcVar6 >> ((byte)uVar5 & 0x3f)) * (long)*(int *)(local_10 + 0xb4) * 4);
    fVar1 = *(float *)((long)&in_stack_ffffffffffffff20->_begin +
                      (long)(*local_40 % *(int *)(local_10 + 0xb4)) * 4);
    pfVar7 = dense_iterator<float>::operator*(&local_88);
    local_58 = (double)fVar1 * (double)pfVar7[2] + local_58;
    pfVar7 = dense_iterator<float>::operator*(&local_88);
    fVar1 = pfVar7[1];
    pfVar7 = dense_iterator<float>::operator*(&local_88);
    local_60 = (double)fVar1 * (double)pfVar7[2] + local_60;
    pfVar7 = dense_iterator<float>::operator*(&local_88);
    fVar1 = pfVar7[1];
    pfVar7 = dense_iterator<float>::operator*(&local_88);
    fVar2 = pfVar7[1];
    pfVar7 = dense_iterator<float>::operator*(&local_88);
    local_68 = (double)fVar1 * (double)fVar2 * (double)pfVar7[3] + local_68;
    pfVar7 = dense_iterator<float>::operator*(&local_88);
    fVar1 = pfVar7[1];
    pfVar7 = dense_iterator<float>::operator*(&local_88);
    local_70 = (double)fVar1 * (double)pfVar7[1] + local_70;
    dense_iterator<float>::operator++(&local_88);
  }
  *local_48 = (local_20 - local_28) / (local_30 * local_58);
  if ((*(byte *)(local_8 + 0x3439) & 1) == 0) {
    fprintf(_stderr,"%-10.5f\t%-10.5f\t%s%-10f\t%-10f\t",local_70 / (local_38 * local_38),
            local_68 / local_38,*local_48,local_60 / local_58," ");
  }
  return local_30 * 0.5;
}

Assistant:

double wolfe_eval(vw& all, bfgs& b, float* mem, double loss_sum, double previous_loss_sum, double step_size,
    double importance_weight_sum, int& origin, double& wolfe1, T& weights)
{
  double g0_d = 0.;
  double g1_d = 0.;
  double g1_Hg1 = 0.;
  double g1_g1 = 0.;

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    float* mem1 = mem + (w.index() >> weights.stride_shift()) * b.mem_stride;
    g0_d += ((double)mem1[(MEM_GT + origin) % b.mem_stride]) * ((&(*w))[W_DIR]);
    g1_d += ((double)(&(*w))[W_GT]) * (&(*w))[W_DIR];
    g1_Hg1 += ((double)(&(*w))[W_GT]) * (&(*w))[W_GT] * ((&(*w))[W_COND]);
    g1_g1 += ((double)(&(*w))[W_GT]) * (&(*w))[W_GT];
  }

  wolfe1 = (loss_sum - previous_loss_sum) / (step_size * g0_d);
  double wolfe2 = g1_d / g0_d;
  // double new_step_cross = (loss_sum-previous_loss_sum-g1_d*step)/(g0_d-g1_d);

  if (!all.quiet)
    fprintf(stderr, "%-10.5f\t%-10.5f\t%s%-10f\t%-10f\t", g1_g1 / (importance_weight_sum * importance_weight_sum),
        g1_Hg1 / importance_weight_sum, " ", wolfe1, wolfe2);
  return 0.5 * step_size;
}